

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::DefinedFunc>::RefPtr
          (RefPtr<wabt::interp::DefinedFunc> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  DefinedFunc *pDVar2;
  Instr instr;
  RunResult RVar3;
  Index IVar4;
  undefined8 unaff_RBX;
  Thread *this_00;
  undefined8 unaff_R14;
  uint uStack_3c;
  Ref local_20;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar1 & 1) == 0) {
    this_00 = (Thread *)(long)(int)pOVar1->kind_;
    if (this_00 != (Thread *)0x4) {
      if (ref.index == 0) {
        this_00 = (Thread *)0x0;
      }
      interp::RefPtr((interp *)this_00);
      instr.field_2.imm_u64 = unaff_RBX;
      instr.op.enum_ = (undefined4)local_20.index;
      instr.kind = local_20.index._4_4_;
      instr.field_2._8_8_ = unaff_R14;
      RVar3 = Thread::Load<unsigned_int>(this_00,instr,&uStack_3c,(Ptr *)store);
      if (RVar3 == Ok) {
        Thread::Push(this_00,(Value)ZEXT416(uStack_3c));
      }
      return;
    }
    local_20.index = ref.index;
    IVar4 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar4;
    pDVar2 = (DefinedFunc *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pDVar2 & 1) == 0) {
      this->obj_ = pDVar2;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe5,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}